

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O3

void __thiscall Analyser::analyse_function_call(Analyser *this)

{
  int iVar1;
  long *plVar2;
  string *psVar3;
  size_type *psVar4;
  ulong uVar5;
  vector<char,_std::allocator<char>_> para;
  optional<Token> next;
  string func;
  _Arg local_138;
  _Storage<Token,_false> *local_130;
  long local_128;
  undefined1 local_120 [32];
  bool local_100;
  _Storage<Token,_false> local_f8;
  char local_d8;
  string local_d0;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  nextToken((optional<Token> *)local_120,this);
  if ((local_100 != true) || (local_120._0_4_ != IDENTIFIER)) {
    psVar3 = (string *)__cxa_allocate_exception(0x28);
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Missing identifier","");
    iVar1 = this->_currentLine;
    *(string **)psVar3 = psVar3 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar3,local_50,local_50 + local_48);
    *(long *)(psVar3 + 0x20) = (long)iVar1;
    __cxa_throw(psVar3,&Error::typeinfo,Error::~Error);
  }
  local_f8._M_value._value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  if ((_func_void__Op_any_ptr__Arg_ptr *)local_120._8_8_ == (_func_void__Op_any_ptr__Arg_ptr *)0x0)
  {
    local_f8._0_8_ = (code *)0x0;
  }
  else {
    local_138._M_obj = &local_f8;
    (*(code *)local_120._8_8_)(_Op_clone,(any *)(local_120 + 8),&local_138);
  }
  plVar2 = (long *)std::__any_caster<std::__cxx11::string>((any *)&local_f8._M_value);
  if (plVar2 == (long *)0x0) {
    std::__throw_bad_any_cast();
  }
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_d0.field_2._M_allocated_capacity = *psVar4;
    local_d0.field_2._8_4_ = (undefined4)plVar2[3];
    local_d0.field_2._12_4_ = *(undefined4 *)((long)plVar2 + 0x1c);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar4;
    local_d0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_d0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((code *)local_f8._0_8_ != (code *)0x0) {
    (*(code *)local_f8._0_8_)(3,&local_f8,0);
  }
  iVar1 = getFunctionIndex(this,&local_d0);
  getFunctionParameter((vector<char,_std::allocator<char>_> *)&local_138,this,&local_d0);
  nextToken((optional<Token> *)&local_f8._M_value,this);
  std::_Optional_payload_base<Token>::_M_move_assign
            ((_Optional_payload_base<Token> *)local_120,
             (_Optional_payload_base<Token> *)&local_f8._M_value);
  if (local_d8 == '\x01') {
    std::_Optional_payload_base<Token>::_M_destroy
              ((_Optional_payload_base<Token> *)&local_f8._M_value);
  }
  if ((local_100 != true) || (local_120._0_4_ != LEFT_BRACKET)) {
    psVar3 = (string *)__cxa_allocate_exception(0x28);
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Missing \'(\'","");
    iVar1 = this->_currentLine;
    *(string **)psVar3 = psVar3 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar3,local_70,local_70 + local_68);
    *(long *)(psVar3 + 0x20) = (long)iVar1;
    __cxa_throw(psVar3,&Error::typeinfo,Error::~Error);
  }
  if (local_130 != (_Storage<Token,_false> *)local_138._M_obj) {
    uVar5 = 0;
    do {
      analyse_expression(this);
      if (uVar5 != (long)local_130 + ~(ulong)local_138._M_obj) {
        nextToken((optional<Token> *)&local_f8._M_value,this);
        std::_Optional_payload_base<Token>::_M_move_assign
                  ((_Optional_payload_base<Token> *)local_120,
                   (_Optional_payload_base<Token> *)&local_f8._M_value);
        if (local_d8 == '\x01') {
          std::_Optional_payload_base<Token>::_M_destroy
                    ((_Optional_payload_base<Token> *)&local_f8._M_value);
        }
        if ((local_100 != true) || (local_120._0_4_ != COMMA_SIGH)) {
          psVar3 = (string *)__cxa_allocate_exception(0x28);
          local_90 = local_80;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Missing \',\'","");
          iVar1 = this->_currentLine;
          *(string **)psVar3 = psVar3 + 0x10;
          std::__cxx11::string::_M_construct<char*>(psVar3,local_90,local_90 + local_88);
          *(long *)(psVar3 + 0x20) = (long)iVar1;
          __cxa_throw(psVar3,&Error::typeinfo,Error::~Error);
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)local_130 - (long)local_138));
  }
  nextToken((optional<Token> *)&local_f8._M_value,this);
  std::_Optional_payload_base<Token>::_M_move_assign
            ((_Optional_payload_base<Token> *)local_120,
             (_Optional_payload_base<Token> *)&local_f8._M_value);
  if (local_d8 == '\x01') {
    std::_Optional_payload_base<Token>::_M_destroy
              ((_Optional_payload_base<Token> *)&local_f8._M_value);
  }
  if ((local_100 == true) && (local_120._0_4_ == RIGHT_BRACKET)) {
    local_f8._4_4_ = iVar1;
    local_f8._M_value._type = 7;
    local_f8._M_value._value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x100000000;
    addInstruction(this,(Instruction *)&local_f8._M_value);
    if ((_Storage<Token,_false> *)local_138._M_obj != (_Storage<Token,_false> *)0x0) {
      operator_delete(local_138._M_obj,local_128 - (long)local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (local_100 == true) {
      std::_Optional_payload_base<Token>::_M_destroy((_Optional_payload_base<Token> *)local_120);
    }
    return;
  }
  psVar3 = (string *)__cxa_allocate_exception(0x28);
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Missing \')\'","");
  iVar1 = this->_currentLine;
  *(string **)psVar3 = psVar3 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar3,local_b0,local_b0 + local_a8);
  *(long *)(psVar3 + 0x20) = (long)iVar1;
  __cxa_throw(psVar3,&Error::typeinfo,Error::~Error);
}

Assistant:

void Analyser::analyse_function_call() {
	//<identifier>
	auto next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::IDENTIFIER) {
		throw Error("Missing identifier", _currentLine);
	}
	std::string func = std::any_cast<std::string>(next.value().GetValue());
	int index = getFunctionIndex(func);
	std::vector<char> para = getFunctionParameter(func);
	//'('
	next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::LEFT_BRACKET) {
		throw Error("Missing '('", _currentLine);
	}
	//<expression-list>
	for (int i = 0; i < para.size(); i++) {
		analyse_expression();
		if (i != para.size() - 1) {
			next = nextToken();
			if (!next.has_value() || next.value().GetType() != TokenType::COMMA_SIGH) {
				throw Error("Missing ','", _currentLine);
			}
		}
	}
	//')'
	next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::RIGHT_BRACKET) {
		throw Error("Missing ')'", _currentLine);
	}
	addInstruction(Instruction(Operation::call, index));
}